

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yv12extend.c
# Opt level: O1

void aom_yv12_copy_u_c(YV12_BUFFER_CONFIG *src_bc,YV12_BUFFER_CONFIG *dst_bc,int use_crop)

{
  long lVar1;
  int iVar2;
  uint8_t *__src;
  void *__src_00;
  uint8_t *__dest;
  void *__dest_00;
  size_t __n;
  
  lVar1 = (ulong)(use_crop != 0) * 0x10;
  __n = (size_t)*(int *)((long)src_bc->store_buf_adr + lVar1 + -0x44);
  iVar2 = *(int *)((long)src_bc->store_buf_adr + lVar1 + -0x3c);
  __src = (src_bc->field_5).field_0.u_buffer;
  __dest = (dst_bc->field_5).field_0.u_buffer;
  if ((src_bc->flags & 8) == 0) {
    if (0 < iVar2) {
      do {
        memcpy(__dest,__src,__n);
        __src = __src + (src_bc->field_4).field_0.uv_stride;
        __dest = __dest + (dst_bc->field_4).field_0.uv_stride;
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
  }
  else if (0 < iVar2) {
    __dest_00 = (void *)((long)__dest * 2);
    __src_00 = (void *)((long)__src * 2);
    do {
      memcpy(__dest_00,__src_00,__n * 2);
      __src_00 = (void *)((long)__src_00 + (long)(src_bc->field_4).field_0.uv_stride * 2);
      __dest_00 = (void *)((long)__dest_00 + (long)(dst_bc->field_4).field_0.uv_stride * 2);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  return;
}

Assistant:

void aom_yv12_copy_u_c(const YV12_BUFFER_CONFIG *src_bc,
                       YV12_BUFFER_CONFIG *dst_bc, int use_crop) {
  int row;
  int width = use_crop ? src_bc->uv_crop_width : src_bc->uv_width;
  int height = use_crop ? src_bc->uv_crop_height : src_bc->uv_height;
  const uint8_t *src = src_bc->u_buffer;
  uint8_t *dst = dst_bc->u_buffer;
#if CONFIG_AV1_HIGHBITDEPTH
  if (src_bc->flags & YV12_FLAG_HIGHBITDEPTH) {
    const uint16_t *src16 = CONVERT_TO_SHORTPTR(src);
    uint16_t *dst16 = CONVERT_TO_SHORTPTR(dst);
    for (row = 0; row < height; ++row) {
      memcpy(dst16, src16, width * sizeof(uint16_t));
      src16 += src_bc->uv_stride;
      dst16 += dst_bc->uv_stride;
    }
    return;
  }
#endif
  for (row = 0; row < height; ++row) {
    memcpy(dst, src, width);
    src += src_bc->uv_stride;
    dst += dst_bc->uv_stride;
  }
}